

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvbocu.cpp
# Opt level: O0

int32_t decodeBocu1LeadByte(int32_t b)

{
  undefined4 local_14;
  undefined4 local_10;
  int32_t count;
  int32_t diff;
  int32_t b_local;
  
  if (b < 0x50) {
    if (b < 0x25) {
      if (b < 0x22) {
        local_10 = -0xddcf77;
        local_14 = 3;
      }
      else {
        local_10 = (b + -0x25) * 0xe6a9 + -0x2911;
        local_14 = 2;
      }
    }
    else {
      local_10 = (b + -0x50) * 0xf3 + -0x40;
      local_14 = 1;
    }
  }
  else if (b < 0xfb) {
    local_10 = (b + -0xd0) * 0xf3 + 0x40;
    local_14 = 1;
  }
  else if (b < 0xfe) {
    local_10 = (b + -0xfb) * 0xe6a9 + 0x2911;
    local_14 = 2;
  }
  else {
    local_10 = 0x2dd0c;
    local_14 = 3;
  }
  return local_10 << 2 | local_14;
}

Assistant:

static inline int32_t
decodeBocu1LeadByte(int32_t b) {
    int32_t diff, count;

    if(b>=BOCU1_START_NEG_2) {
        /* positive difference */
        if(b<BOCU1_START_POS_3) {
            /* two bytes */
            diff=((int32_t)b-BOCU1_START_POS_2)*BOCU1_TRAIL_COUNT+BOCU1_REACH_POS_1+1;
            count=1;
        } else if(b<BOCU1_START_POS_4) {
            /* three bytes */
            diff=((int32_t)b-BOCU1_START_POS_3)*BOCU1_TRAIL_COUNT*BOCU1_TRAIL_COUNT+BOCU1_REACH_POS_2+1;
            count=2;
        } else {
            /* four bytes */
            diff=BOCU1_REACH_POS_3+1;
            count=3;
        }
    } else {
        /* negative difference */
        if(b>=BOCU1_START_NEG_3) {
            /* two bytes */
            diff=((int32_t)b-BOCU1_START_NEG_2)*BOCU1_TRAIL_COUNT+BOCU1_REACH_NEG_1;
            count=1;
        } else if(b>BOCU1_MIN) {
            /* three bytes */
            diff=((int32_t)b-BOCU1_START_NEG_3)*BOCU1_TRAIL_COUNT*BOCU1_TRAIL_COUNT+BOCU1_REACH_NEG_2;
            count=2;
        } else {
            /* four bytes */
            diff=-BOCU1_TRAIL_COUNT*BOCU1_TRAIL_COUNT*BOCU1_TRAIL_COUNT+BOCU1_REACH_NEG_3;
            count=3;
        }
    }

    /* return the state for decoding the trail byte(s) */
    return (diff<<2)|count;
}